

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::rowsInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  QDebug *o;
  QAbstractItemModel *pQVar7;
  QAbstractItemModel *pQVar8;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  Changing c;
  undefined4 uVar9;
  undefined4 uVar10;
  int in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  undefined6 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3e;
  undefined1 in_stack_fffffffffffffb3f;
  QMessageLogger *in_stack_fffffffffffffb40;
  QModelIndex *in_stack_fffffffffffffb48;
  QDebug *in_stack_fffffffffffffb58;
  QAbstractItemModel *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  char *in_stack_fffffffffffffb88;
  undefined1 *puVar11;
  undefined4 in_stack_fffffffffffffbc8;
  undefined2 in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  char *in_stack_fffffffffffffbd0;
  QAbstractItemModel *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  QAbstractItemModelTesterPrivate *in_stack_fffffffffffffbf0;
  QModelIndex *in_stack_fffffffffffffbf8;
  QAbstractItemModelTesterPrivate *in_stack_fffffffffffffc00;
  QDebug *in_stack_fffffffffffffc60;
  int local_388;
  int local_380;
  undefined1 local_358 [24];
  undefined1 local_340 [56];
  QDebug local_308;
  QDebug local_300;
  QDebug local_2f8;
  undefined1 local_2f0 [24];
  undefined1 local_2d8 [80];
  QDebug local_288;
  undefined1 local_280 [56];
  QDebug local_248;
  undefined1 local_240 [24];
  undefined1 local_228 [24];
  int local_210;
  undefined4 local_20c;
  undefined1 local_208 [24];
  QModelIndex local_1f0;
  undefined1 local_1d0 [72];
  QDebug local_188;
  QDebug local_180;
  QDebug local_178;
  undefined4 local_16c;
  undefined1 *local_168;
  undefined1 *local_160;
  Data *local_158;
  QObject *local_150;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  undefined1 local_a8 [24];
  int local_90;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_16c = 6;
  uVar9 = 0x348;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_stack_fffffffffffffbf0,
                     (ChangeInFlight *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                     ,(ChangeInFlight *)
                      CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                     (char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                     (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                      CONCAT16(in_stack_fffffffffffffbce,
                                               CONCAT24(in_stack_fffffffffffffbcc,
                                                        in_stack_fffffffffffffbc8))),
                     (int)in_stack_fffffffffffffc60);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00190b6c;
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  local_158 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_150 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  lcModelTest();
  anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffb2c,uVar9));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_158), local_380 = in_EDX, bVar1) {
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x18fd17);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffb40,
               (char *)CONCAT17(in_stack_fffffffffffffb3f,
                                CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38)),
               in_stack_fffffffffffffb34,(char *)CONCAT44(in_stack_fffffffffffffb2c,uVar9),
               (char *)0x18fd36);
    in_stack_fffffffffffffc60 = &local_188;
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
    QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       in_stack_fffffffffffffb2c);
    QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       in_stack_fffffffffffffb2c);
    o = QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
    QDebug::QDebug(&local_180,o);
    ::operator<<((Stream *)&local_178,(QModelIndex *)&local_180);
    QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18fe6c);
    (**(code **)(*(long *)pQVar7 + 0x90))(&local_28,pQVar7,in_RSI,0);
    QVariant::toString();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffb40,
                       (QString *)
                       CONCAT17(in_stack_fffffffffffffb3f,
                                CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38)));
    QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18fef4);
    (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,in_RSI);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       in_stack_fffffffffffffb2c);
    QString::~QString((QString *)0x18ff34);
    QVariant::~QVariant(&local_28);
    QDebug::~QDebug(&local_178);
    QDebug::~QDebug(&local_180);
    QDebug::~QDebug(&local_188);
    local_150 = (QObject *)((ulong)local_150 & 0xffffffffffffff00);
  }
  for (; iVar5 = (int)in_stack_fffffffffffffc60, local_380 <= in_ECX; local_380 = local_380 + 1) {
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    lcModelTest();
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffb2c,uVar9));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_168), bVar1) {
      anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1900b6);
      in_stack_fffffffffffffbf8 = &local_1f0;
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffb40,
                 (char *)CONCAT17(in_stack_fffffffffffffb3f,
                                  CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38)),
                 in_stack_fffffffffffffb34,(char *)CONCAT44(in_stack_fffffffffffffb2c,uVar9),
                 (char *)0x1900d5);
      in_stack_fffffffffffffc00 = (QAbstractItemModelTesterPrivate *)local_1d0;
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffb58,in_stack_fffffffffffffb88);
      in_stack_fffffffffffffbf0 =
           (QAbstractItemModelTesterPrivate *)
           QDebug::operator<<((QDebug *)
                              CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              in_stack_fffffffffffffb2c);
      pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x19013f);
      (**(code **)(*(long *)pQVar7 + 0x60))(local_208,pQVar7,local_380,0,in_RSI);
      QModelIndex::data(in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
      ::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (QVariant *)in_stack_fffffffffffffb60);
      QDebug::~QDebug((QDebug *)(local_1d0 + 8));
      QVariant::~QVariant(&local_48);
      QDebug::~QDebug((QDebug *)local_1d0);
      local_160 = (undefined1 *)((ulong)local_160 & 0xffffffffffffff00);
    }
  }
  memset(local_a8,0xaa,0x60);
  QStack<QAbstractItemModelTesterPrivate::Changing>::pop
            ((QStack<QAbstractItemModelTesterPrivate::Changing> *)
             CONCAT44(in_stack_fffffffffffffb2c,uVar9));
  bVar1 = compare<QModelIndex,QModelIndex>
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                     (QModelIndex *)in_stack_fffffffffffffbf0,
                     (char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                     (char *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                     (char *)in_stack_fffffffffffffbd8,(int)in_RDI);
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbec);
  if (bVar1) {
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x190303);
    uVar4 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,in_RSI);
    local_210 = (in_ECX - in_EDX) + 1 + local_90;
    uVar10 = 0x359;
    local_20c = uVar4;
    uVar2 = compare<int,int>(in_stack_fffffffffffffbf0,(int *)CONCAT44(uVar9,uVar4),
                             (int *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             (char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                              CONCAT16(in_stack_fffffffffffffbce,
                                                       CONCAT24(in_stack_fffffffffffffbcc,
                                                                in_stack_fffffffffffffbc8))),iVar5);
    if (((uVar2 ^ 0xff) & 1) == 0) {
      if (-1 < in_EDX + -1) {
        in_stack_fffffffffffffbd8 =
             QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1903e9);
        pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1903fe);
        (**(code **)(*(long *)pQVar7 + 0x60))(local_228,pQVar7,in_EDX + -1,0,local_a8);
        (**(code **)(*(long *)in_stack_fffffffffffffbd8 + 0x90))
                  (&local_c8,in_stack_fffffffffffffbd8,local_228,0);
        uVar10 = 0x35b;
        bVar1 = compare<QVariant,QVariant>
                          (in_stack_fffffffffffffc00,(QVariant *)in_stack_fffffffffffffbf8,
                           (QVariant *)in_stack_fffffffffffffbf0,(char *)CONCAT44(uVar9,uVar4),
                           (char *)CONCAT17(uVar2,in_stack_fffffffffffffbe0),
                           (char *)in_stack_fffffffffffffbd8,(int)in_RDI);
        bVar3 = bVar1 ^ 0xff;
        QVariant::~QVariant(&local_c8);
        if ((bVar3 & 1) != 0) goto LAB_00190b5f;
      }
      pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x19051e);
      iVar5 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,local_a8);
      if (in_ECX + 1 < iVar5) {
        pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x19057a);
        pQVar8 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x19058f);
        (**(code **)(*(long *)pQVar8 + 0x60))(local_240,pQVar8,in_ECX + 1,0,local_a8);
        (**(code **)(*(long *)pQVar7 + 0x90))(&local_e8,pQVar7,local_240,0);
        bVar1 = ::operator!=((QVariant *)
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                             (QVariant *)CONCAT44(in_stack_fffffffffffffb2c,uVar10));
        QVariant::~QVariant(&local_e8);
        iVar5 = (int)in_RDI;
        if (bVar1) {
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffb40,
                     (char *)CONCAT17(in_stack_fffffffffffffb3f,
                                      CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38))
                     ,in_stack_fffffffffffffb34,(char *)CONCAT44(in_stack_fffffffffffffb2c,uVar10));
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                             ,in_stack_fffffffffffffb2c);
          QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                             ,in_stack_fffffffffffffb2c);
          QDebug::~QDebug(&local_248);
          local_388 = 0;
          while( true ) {
            pQVar7 = QPointer<QAbstractItemModel>::operator->
                               ((QPointer<QAbstractItemModel> *)0x1906a4);
            puVar11 = local_280;
            QModelIndex::QModelIndex((QModelIndex *)0x1906bb);
            iVar6 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,puVar11);
            iVar5 = (int)in_RDI;
            if (iVar6 <= local_388) break;
            QMessageLogger::QMessageLogger
                      (in_stack_fffffffffffffb40,
                       (char *)CONCAT17(in_stack_fffffffffffffb3f,
                                        CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38
                                                )),in_stack_fffffffffffffb34,
                       (char *)CONCAT44(in_stack_fffffffffffffb2c,uVar10));
            QMessageLogger::debug();
            in_stack_fffffffffffffb60 =
                 QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x190722);
            in_stack_fffffffffffffb6c = local_388;
            QModelIndex::QModelIndex((QModelIndex *)0x190744);
            (**(code **)(*(long *)in_stack_fffffffffffffb60 + 0x60))
                      (local_2d8,in_stack_fffffffffffffb60,in_stack_fffffffffffffb6c,0,local_2f0);
            QModelIndex::data(in_stack_fffffffffffffb48,
                              (int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
            QVariant::toString();
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffb40,
                               (QString *)
                               CONCAT17(in_stack_fffffffffffffb3f,
                                        CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38
                                                )));
            QString::~QString((QString *)0x1907bb);
            QVariant::~QVariant(&local_108);
            QDebug::~QDebug(&local_288);
            local_388 = local_388 + 1;
          }
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffb40,
                     (char *)CONCAT17(in_stack_fffffffffffffb3f,
                                      CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38))
                     ,in_stack_fffffffffffffb34,(char *)CONCAT44(in_stack_fffffffffffffb2c,uVar10));
          QMessageLogger::debug();
          ::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       (QVariant *)in_stack_fffffffffffffb60);
          pQVar7 = QPointer<QAbstractItemModel>::operator->
                             ((QPointer<QAbstractItemModel> *)0x190919);
          pQVar8 = QPointer<QAbstractItemModel>::operator->
                             ((QPointer<QAbstractItemModel> *)0x190928);
          (**(code **)(*(long *)pQVar8 + 0x60))(local_340,pQVar8,in_ECX + 1,0,local_a8);
          (**(code **)(*(long *)pQVar7 + 0x90))(&local_128,pQVar7,local_340,0);
          ::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       (QVariant *)in_stack_fffffffffffffb60);
          QDebug::~QDebug(&local_2f8);
          QVariant::~QVariant(&local_128);
          QDebug::~QDebug(&local_300);
          QDebug::~QDebug(&local_308);
        }
        pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x190a5b);
        pQVar8 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x190a6a);
        (**(code **)(*(long *)pQVar8 + 0x60))(local_358,pQVar8,in_ECX + 1,0,local_a8);
        (**(code **)(*(long *)pQVar7 + 0x90))(&local_148,pQVar7,local_358,0);
        compare<QVariant,QVariant>
                  (in_stack_fffffffffffffc00,(QVariant *)in_stack_fffffffffffffbf8,
                   (QVariant *)in_stack_fffffffffffffbf0,(char *)CONCAT44(uVar9,uVar4),
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffbe0),
                   (char *)in_stack_fffffffffffffbd8,iVar5);
        QVariant::~QVariant(&local_148);
      }
    }
  }
LAB_00190b5f:
  Changing::~Changing((Changing *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
LAB_00190b6c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsInserted(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::RowsInserted);
    changeInFlight = ChangeInFlight::None;

    qCDebug(lcModelTest) << "rowsInserted"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent);

    for (int i = start; i <= end; ++i) {
        qCDebug(lcModelTest) << "    itemWasInserted:" << i
                             << model->index(i, 0, parent).data();
    }


    Changing c = insert.pop();
    MODELTESTER_COMPARE(parent, c.parent);

    MODELTESTER_COMPARE(model->rowCount(parent), c.oldSize + (end - start + 1));
    if (start - 1 >= 0)
        MODELTESTER_COMPARE(model->data(model->index(start - 1, 0, c.parent)), c.last);

    if (end + 1 < model->rowCount(c.parent)) {
        if (c.next != model->data(model->index(end + 1, 0, c.parent))) {
            qDebug() << start << end;
            for (int i = 0; i < model->rowCount(); ++i)
                qDebug() << model->index(i, 0).data().toString();
            qDebug() << c.next << model->data(model->index(end + 1, 0, c.parent));
        }

        MODELTESTER_COMPARE(model->data(model->index(end + 1, 0, c.parent)), c.next);
    }
}